

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *zlibsettings;
  LodePNGColorMode *color_00;
  LodePNGInfo *info;
  LodePNGColorMode *dest;
  LodePNGColorType LVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var5;
  long lVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  size_t sVar11;
  uchar uVar12;
  ushort uVar13;
  uint uVar14;
  byte *pbVar15;
  uchar *puVar16;
  size_t sVar17;
  uchar *puVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint *data;
  size_t newsize;
  long lVar29;
  size_t __size;
  uint uVar30;
  size_t bytewidth;
  uint *puVar31;
  LodePNGColorMode *color;
  uchar *local_278;
  size_t sStack_270;
  size_t local_268;
  uint *local_258;
  size_t local_250;
  size_t *local_248;
  uchar **local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  uVar14 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar14;
  if (uVar14 != 0) {
    return uVar14;
  }
  lVar29 = (ulong)*h * (ulong)*w;
  uVar14 = (uint)lVar29;
  if (*h == 0) {
    if (0xfffffff < uVar14) goto LAB_001a951b;
  }
  else if ((int)((ulong)lVar29 >> 0x20) != 0 || 0xfffffff < uVar14) {
LAB_001a951b:
    state->error = 0x5c;
    return 0x5c;
  }
  puVar31 = (uint *)(in + 0x21);
  color_00 = &(state->info_png).color;
  info = &state->info_png;
  zlibsettings = &state->decoder;
  local_240 = (state->info_png).unknown_chunks_data;
  local_248 = (state->info_png).unknown_chunks_size;
  iVar28 = 1;
  bVar10 = false;
  local_250 = 0;
  uVar24 = 0;
  puVar18 = (uchar *)0x0;
  local_258 = w;
  do {
    if (state->error != 0) break;
    pbVar15 = (byte *)((long)puVar31 + (0xc - (long)in));
    uVar14 = 0x1e;
    if ((insize < pbVar15) || (puVar31 < in)) {
LAB_001a9b94:
      state->error = uVar14;
      break;
    }
    uVar20 = (uint)(byte)*puVar31 << 0x18;
    if ((int)uVar20 < 0) {
      uVar14 = 0x3f;
      goto LAB_001a9b94;
    }
    uVar20 = (uint)*(byte *)((long)puVar31 + 3) | (uint)*(byte *)((long)puVar31 + 1) << 0x10 |
             (uint)*(byte *)((long)puVar31 + 2) << 8 | uVar20;
    uVar19 = (ulong)uVar20;
    if ((insize < pbVar15 + uVar19) || ((byte *)((long)puVar31 + uVar19 + 0xc) < in)) {
      uVar14 = 0x40;
      goto LAB_001a9b94;
    }
    data = puVar31 + 2;
    uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"IDAT");
    if (uVar12 == '\0') {
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"IEND");
      if (uVar12 != '\0') {
        bVar9 = true;
        bVar8 = false;
        goto LAB_001a971f;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"PLTE");
      if (uVar12 != '\0') {
        puVar16 = (state->info_png).color.palette;
        if (puVar16 != (uchar *)0x0) {
          free(puVar16);
        }
        (state->info_png).color.palettesize = uVar19 / 3;
        puVar16 = (uchar *)malloc(uVar19 / 3 << 2);
        (state->info_png).color.palette = puVar16;
        if ((uVar20 < 3) || (puVar16 != (uchar *)0x0)) {
          if (uVar20 < 0x303) {
            iVar28 = 2;
            if (2 < uVar20) {
              uVar14 = 1;
              uVar20 = 3;
              iVar28 = 2;
              uVar19 = 2;
              do {
                iVar7 = (int)uVar19;
                (state->info_png).color.palette[uVar20 - 3] =
                     *(byte *)((long)data + (ulong)(iVar7 - 2));
                (state->info_png).color.palette[uVar20 - 2] =
                     *(byte *)((long)data + (ulong)(iVar7 - 1));
                (state->info_png).color.palette[uVar20 - 1] = *(byte *)((long)data + uVar19);
                (state->info_png).color.palette[uVar20] = 0xff;
                uVar21 = (ulong)uVar14;
                uVar14 = uVar14 + 1;
                uVar20 = uVar20 + 4;
                uVar19 = (ulong)(iVar7 + 3);
              } while ((state->info_png).color.palettesize != uVar21);
            }
LAB_001a99c1:
            state->error = 0;
            bVar8 = true;
            bVar9 = false;
            goto LAB_001a971f;
          }
LAB_001a9b75:
          uVar14 = 0x26;
        }
        else {
          (state->info_png).color.palettesize = 0;
          uVar14 = 0x53;
        }
        goto LAB_001a9b94;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"tRNS");
      if (uVar12 != '\0') {
        LVar1 = color_00->colortype;
        if (LVar1 == LCT_GREY) {
          uVar14 = 0x1e;
          if (uVar20 == 2) {
            (state->info_png).color.key_defined = 1;
            uVar13 = (ushort)puVar31[2] << 8 | (ushort)puVar31[2] >> 8;
            (state->info_png).color.key_b = (uint)uVar13;
            (state->info_png).color.key_g = (uint)uVar13;
            lVar29 = 0x1c;
LAB_001a99b9:
            *(uint *)((long)&color_00->colortype + lVar29) = (uint)uVar13;
            goto LAB_001a99c1;
          }
        }
        else if (LVar1 == LCT_RGB) {
          if (uVar20 == 6) {
            (state->info_png).color.key_defined = 1;
            (state->info_png).color.key_r =
                 (uint)(ushort)((ushort)puVar31[2] << 8 | (ushort)puVar31[2] >> 8);
            (state->info_png).color.key_g =
                 (uint)(ushort)(*(ushort *)((long)puVar31 + 10) << 8 |
                               *(ushort *)((long)puVar31 + 10) >> 8);
            uVar13 = (ushort)puVar31[3] << 8 | (ushort)puVar31[3] >> 8;
            lVar29 = 0x24;
            goto LAB_001a99b9;
          }
          uVar14 = 0x29;
        }
        else {
          if (LVar1 == LCT_PALETTE) {
            if ((state->info_png).color.palettesize < uVar19) goto LAB_001a9b75;
            if (uVar19 != 0) {
              uVar21 = 0;
              do {
                (state->info_png).color.palette[(uVar21 & 0xffffffff) + 3] = (byte)*data;
                uVar21 = uVar21 + 4;
                data = (uint *)((long)data + 1);
              } while (uVar19 << 2 != uVar21);
            }
            goto LAB_001a99c1;
          }
          uVar14 = 0x2a;
        }
        goto LAB_001a9b94;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"bKGD");
      if (uVar12 != '\0') {
        uVar14 = readChunk_bKGD(info,(uchar *)data,uVar19);
        goto LAB_001a9917;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"tEXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_tEXt(info,(uchar *)data,uVar19);
LAB_001a9a74:
          state->error = uVar14;
          if (uVar14 != 0) break;
        }
LAB_001a9a83:
        bVar8 = true;
        bVar9 = false;
        goto LAB_001a971f;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"zTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_zTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar19);
          goto LAB_001a9a74;
        }
        goto LAB_001a9a83;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"iTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_iTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar19);
          goto LAB_001a9a74;
        }
        goto LAB_001a9a83;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"tIME");
      if (uVar12 != '\0') {
        uVar14 = readChunk_tIME(info,(uchar *)data,uVar19);
LAB_001a9917:
        state->error = uVar14;
        if (uVar14 == 0) goto LAB_001a9a83;
        break;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)puVar31,"pHYs");
      if (uVar12 != '\0') {
        uVar14 = readChunk_pHYs(info,(uchar *)data,uVar19);
        goto LAB_001a9917;
      }
      if ((puVar31[1] & 0x20) == 0) {
        uVar14 = 0x45;
        goto LAB_001a9b94;
      }
      bVar10 = true;
      if ((state->decoder).remember_unknown_chunks != 0) {
        uVar14 = lodepng_chunk_append
                           (local_240 + (iVar28 - 1U),local_248 + (iVar28 - 1U),(uchar *)puVar31);
        state->error = uVar14;
        if (uVar14 != 0) break;
      }
      bVar9 = false;
LAB_001a9750:
      uVar14 = *puVar31;
      puVar31 = (uint *)((long)puVar31 +
                        (ulong)((uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8
                                | uVar14 << 0x18) + 0xc));
    }
    else {
      uVar21 = uVar24 + uVar19;
      puVar16 = puVar18;
      if (local_250 < uVar21) {
        uVar26 = uVar21 * 3 >> 1;
        if (local_250 * 2 < uVar21) {
          uVar26 = uVar21;
        }
        puVar16 = (uchar *)realloc(puVar18,uVar26);
        local_250 = uVar26;
        if (puVar16 == (uchar *)0x0) {
          uVar14 = 0x53;
          goto LAB_001a9b94;
        }
      }
      bVar8 = true;
      iVar28 = 3;
      if (uVar19 != 0) {
        uVar26 = 0;
        do {
          puVar16[uVar26 + uVar24] = *(byte *)((long)data + uVar26);
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
      }
      bVar9 = false;
      uVar24 = uVar21;
      puVar18 = puVar16;
LAB_001a971f:
      if ((state->decoder).ignore_crc == 0 && !bVar10) {
        uVar14 = lodepng_chunk_check_crc((uchar *)puVar31);
        bVar10 = false;
        if (uVar14 != 0) {
          uVar14 = 0x39;
          goto LAB_001a9b94;
        }
      }
      if (bVar8) goto LAB_001a9750;
    }
  } while (!bVar9);
  puVar31 = local_258;
  local_278 = (uchar *)0x0;
  sStack_270 = 0;
  local_268 = 0;
  uVar14 = *local_258;
  if ((state->info_png).interlace_method == 0) {
    uVar19 = (ulong)(state->info_png).color.colortype;
    iVar28 = 0;
    if (uVar19 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
    }
    __size = (ulong)(((state->info_png).color.bitdepth * uVar14 * iVar28 + 7 >> 3) * *h) + (ulong)*h
    ;
  }
  else {
    uVar20 = *h;
    uVar25 = uVar20 + 7 >> 3;
    LVar1 = (state->info_png).color.colortype;
    uVar19 = (ulong)LVar1;
    uVar30 = (state->info_png).color.bitdepth;
    iVar28 = 0;
    if (uVar19 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
    }
    lVar29 = (ulong)(((uVar14 + 7 >> 3) * uVar30 * iVar28 + 7 >> 3) * uVar25) + (ulong)uVar25;
    if (4 < uVar14) {
      iVar28 = 0;
      if (LVar1 < 7) {
        iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
      }
      lVar29 = lVar29 + (ulong)uVar25 +
               (ulong)(((uVar14 + 3 >> 3) * uVar30 * iVar28 + 7 >> 3) * uVar25);
    }
    uVar25 = uVar20 + 3 >> 3;
    iVar28 = 0;
    if (LVar1 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
    }
    lVar29 = lVar29 + (ulong)uVar25 +
                      (ulong)(((uVar14 + 3 >> 2) * uVar30 * iVar28 + 7 >> 3) * uVar25);
    if (2 < uVar14) {
      uVar25 = uVar20 + 3 >> 2;
      iVar28 = 0;
      if (LVar1 < 7) {
        iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
      }
      lVar29 = lVar29 + (ulong)uVar25 +
                        (ulong)(((uVar14 + 1 >> 2) * uVar30 * iVar28 + 7 >> 3) * uVar25);
    }
    uVar25 = uVar20 + 1 >> 2;
    iVar28 = 0;
    if (LVar1 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
    }
    lVar29 = lVar29 + (ulong)uVar25 +
                      (ulong)(((uVar14 + 1 >> 1) * uVar30 * iVar28 + 7 >> 3) * uVar25);
    if (1 < uVar14) {
      uVar25 = uVar20 + 1 >> 1;
      iVar28 = 0;
      if (LVar1 < 7) {
        iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
      }
      lVar29 = lVar29 + (ulong)uVar25 + (ulong)(((uVar14 >> 1) * uVar30 * iVar28 + 7 >> 3) * uVar25)
      ;
    }
    iVar28 = 0;
    if (LVar1 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar19 * 4);
    }
    __size = lVar29 + (ulong)(uVar20 >> 1) +
             (ulong)((uVar30 * uVar14 * iVar28 + 7 >> 3) * (uVar20 >> 1));
  }
  if (state->error == 0) {
    puVar16 = local_278;
    sVar11 = local_268;
    if ((__size == 0) ||
       (puVar16 = (uchar *)malloc(__size), sVar11 = __size, puVar16 != (uchar *)0x0)) {
      local_268 = sVar11;
      local_278 = puVar16;
      p_Var5 = (state->decoder).zlibsettings.custom_zlib;
      if (p_Var5 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                     *)0x0) {
        uVar14 = lodepng_zlib_decompress
                           (&local_278,&sStack_270,puVar18,uVar24,&zlibsettings->zlibsettings);
      }
      else {
        uVar14 = (*p_Var5)(&local_278,&sStack_270,puVar18,uVar24,&zlibsettings->zlibsettings);
      }
      uVar20 = 0x5b;
      if (sStack_270 == __size) {
        uVar20 = uVar14;
      }
      if (uVar14 != 0) {
        uVar20 = uVar14;
      }
    }
    else {
      uVar20 = 0x53;
    }
    state->error = uVar20;
  }
  free(puVar18);
  if (state->error != 0) goto LAB_001aa213;
  uVar14 = *puVar31;
  uVar20 = *h;
  sVar17 = lodepng_get_raw_size(uVar14,uVar20,color_00);
  iVar28 = 0;
  if (sVar17 == 0) {
    puVar18 = (uchar *)0x0;
LAB_001a9e77:
    puVar16 = local_278;
    uVar24 = (ulong)(state->info_png).color.colortype;
    if (uVar24 < 7) {
      iVar28 = *(int *)(&DAT_0023f630 + uVar24 * 4);
    }
    uVar30 = iVar28 * (state->info_png).color.bitdepth;
    if (uVar30 == 0) {
      uVar25 = 0x1f;
    }
    else {
      if ((state->info_png).interlace_method == 0) {
        if (uVar30 < 8) {
          uVar23 = uVar30 * uVar14;
          uVar22 = uVar23 + 7 & 0xfffffff8;
          if (uVar23 != uVar22) {
            uVar25 = unfilter(local_278,local_278,uVar14,uVar20,uVar30);
            if (uVar25 != 0) goto LAB_001aa209;
            removePaddingBits(puVar18,puVar16,(ulong)uVar23,(ulong)uVar22,uVar20);
            goto LAB_001aa1d9;
          }
        }
        uVar25 = unfilter(puVar18,local_278,uVar14,uVar20,uVar30);
        if (uVar25 != 0) goto LAB_001aa209;
      }
      else {
        Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar14,uVar20,
                            uVar30);
        lVar29 = 0;
        do {
          lVar6 = *(long *)((long)padded_passstart + lVar29 * 2);
          uVar23 = *(uint *)((long)passw + lVar29);
          uVar22 = *(uint *)((long)passh + lVar29);
          uVar25 = unfilter(puVar16 + lVar6,puVar16 + *(long *)((long)filter_passstart + lVar29 * 2)
                            ,uVar23,uVar22,uVar30);
          if (uVar25 != 0) goto LAB_001aa209;
          if (uVar30 < 8) {
            uVar23 = uVar23 * uVar30;
            removePaddingBits(puVar16 + *(long *)((long)local_178 + lVar29 * 2),puVar16 + lVar6,
                              (ulong)uVar23,(ulong)(uVar23 + 7 & 0xfffffff8),uVar22);
          }
          lVar29 = lVar29 + 4;
        } while (lVar29 != 0x1c);
        Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,uVar14,
                            uVar20,uVar30);
        if (uVar30 < 8) {
          lVar29 = 0;
          do {
            uVar20 = passh_1[lVar29];
            if (uVar20 != 0) {
              uVar25 = passw_1[lVar29];
              uVar23 = 0;
              do {
                if ((ulong)uVar25 != 0) {
                  sVar17 = local_1b8[lVar29];
                  uVar22 = ADAM7_DY[lVar29];
                  uVar2 = ADAM7_IY[lVar29];
                  uVar3 = ADAM7_DX[lVar29];
                  uVar4 = ADAM7_IX[lVar29];
                  uVar24 = 0;
                  do {
                    uVar21 = (ulong)((uVar3 * (int)uVar24 +
                                     (uVar22 * uVar23 + uVar2) * uVar14 + uVar4) * uVar30);
                    uVar19 = (ulong)((uVar23 * uVar25 + (int)uVar24) * uVar30) + sVar17 * 8;
                    uVar27 = uVar30;
                    do {
                      if ((puVar16[uVar19 >> 3] >> (~(byte)uVar19 & 7) & 1) != 0) {
                        puVar18[uVar21 >> 3] = puVar18[uVar21 >> 3] | '\x01' << (~(byte)uVar21 & 7);
                      }
                      uVar21 = uVar21 + 1;
                      uVar19 = uVar19 + 1;
                      uVar27 = uVar27 - 1;
                    } while (uVar27 != 0);
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar20);
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 7);
        }
        else {
          uVar24 = (ulong)(uVar30 >> 3);
          lVar29 = 0;
          do {
            uVar20 = passh_1[lVar29];
            if (uVar20 != 0) {
              uVar30 = passw_1[lVar29];
              uVar19 = 0;
              uVar25 = 0;
              do {
                iVar28 = (int)uVar19;
                if ((ulong)uVar30 != 0) {
                  uVar23 = ADAM7_DX[lVar29];
                  uVar22 = (ADAM7_DY[lVar29] * uVar25 + ADAM7_IY[lVar29]) * uVar14 +
                           ADAM7_IX[lVar29];
                  sVar17 = local_1b8[lVar29];
                  uVar21 = 0;
                  do {
                    uVar26 = 0;
                    do {
                      puVar18[uVar26 + uVar22 * uVar24] = puVar16[uVar26 + uVar19 * uVar24 + sVar17]
                      ;
                      uVar26 = uVar26 + 1;
                    } while (uVar24 != uVar26);
                    uVar21 = uVar21 + 1;
                    uVar22 = uVar22 + uVar23;
                    uVar19 = (ulong)((int)uVar19 + 1);
                  } while (uVar21 != uVar30);
                }
                uVar25 = uVar25 + 1;
                uVar19 = (ulong)(iVar28 + uVar30);
              } while (uVar25 != uVar20);
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 7);
        }
      }
LAB_001aa1d9:
      uVar25 = 0;
    }
  }
  else {
    puVar18 = (uchar *)calloc(1,sVar17);
    if (puVar18 != (uchar *)0x0) goto LAB_001a9e77;
    uVar25 = 0x53;
    puVar18 = (uchar *)0x0;
  }
LAB_001aa209:
  state->error = uVar25;
  *out = puVar18;
LAB_001aa213:
  sStack_270 = 0;
  local_268 = 0;
  free(local_278);
  if (state->error != 0) {
    return state->error;
  }
  dest = &state->info_raw;
  if ((state->decoder).color_convert == 0) {
    uVar14 = lodepng_color_mode_copy(dest,color_00);
    state->error = uVar14;
    return uVar14;
  }
  iVar28 = lodepng_color_mode_equal(dest,color_00);
  if (iVar28 != 0) {
    return 0;
  }
  puVar18 = *out;
  if (((dest->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
    return 0x38;
  }
  uVar14 = *local_258;
  uVar20 = *h;
  sVar17 = lodepng_get_raw_size(uVar14,uVar20,dest);
  puVar16 = (uchar *)malloc(sVar17);
  *out = puVar16;
  if (puVar16 == (uchar *)0x0) {
    uVar14 = 0x53;
  }
  else {
    lodepng_convert(puVar16,puVar18,dest,color_00,uVar14,uVar20);
    uVar14 = 0;
  }
  state->error = uVar14;
  free(puVar18);
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}